

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void WriteArrayVars(FILE *file,FWorldGlobalArray *vars,uint count,DWORD id)

{
  bool bVar1;
  hash_t hVar2;
  ConstPair *local_350;
  Pair *pair;
  ConstIterator it;
  undefined1 local_328 [8];
  FPNGChunkArchive arc;
  uint j;
  uint i;
  DWORD id_local;
  uint count_local;
  FWorldGlobalArray *vars_local;
  FILE *file_local;
  
  arc.Chunk._52_4_ = 0;
  while (((uint)arc.Chunk._52_4_ < count &&
         (hVar2 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed
                            (vars + (uint)arc.Chunk._52_4_), hVar2 == 0))) {
    arc.Chunk._52_4_ = arc.Chunk._52_4_ + 1;
  }
  if ((uint)arc.Chunk._52_4_ < count) {
    arc.Chunk.m_ChunkID = count - 1;
    while (((uint)arc.Chunk._52_4_ < arc.Chunk.m_ChunkID &&
           (hVar2 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed
                              (vars + arc.Chunk.m_ChunkID), hVar2 == 0))) {
      arc.Chunk.m_ChunkID = arc.Chunk.m_ChunkID - 1;
    }
    FPNGChunkArchive::FPNGChunkArchive((FPNGChunkArchive *)local_328,file,id);
    FArchive::WriteCount((FArchive *)local_328,arc.Chunk._52_4_);
    FArchive::WriteCount((FArchive *)local_328,arc.Chunk.m_ChunkID);
    for (; (uint)arc.Chunk._52_4_ <= arc.Chunk.m_ChunkID; arc.Chunk._52_4_ = arc.Chunk._52_4_ + 1) {
      hVar2 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed
                        (vars + (uint)arc.Chunk._52_4_);
      FArchive::WriteCount((FArchive *)local_328,hVar2);
      TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_>::
      TMapConstIterator((TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_>
                         *)&pair,vars + (uint)arc.Chunk._52_4_);
      while (bVar1 = TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_>::
                     NextPair((TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_>
                               *)&pair,&local_350), bVar1) {
        FArchive::WriteCount((FArchive *)local_328,local_350->Key);
        FArchive::WriteCount((FArchive *)local_328,local_350->Value);
      }
    }
    FPNGChunkArchive::~FPNGChunkArchive((FPNGChunkArchive *)local_328);
  }
  return;
}

Assistant:

static void WriteArrayVars (FILE *file, FWorldGlobalArray *vars, unsigned int count, DWORD id)
{
	unsigned int i, j;

	// Find the first non-empty array.
	for (i = 0; i < count; ++i)
	{
		if (vars[i].CountUsed() != 0)
			break;
	}
	if (i < count)
	{
		// Find last non-empty array. Anything beyond the last stored array
		// will be emptied at load time.
		for (j = count-1; j > i; --j)
		{
			if (vars[j].CountUsed() != 0)
				break;
		}
		FPNGChunkArchive arc (file, id);
		arc.WriteCount (i);
		arc.WriteCount (j);
		for (; i <= j; ++i)
		{
			arc.WriteCount (vars[i].CountUsed());

			FWorldGlobalArray::ConstIterator it(vars[i]);
			const FWorldGlobalArray::Pair *pair;

			while (it.NextPair (pair))
			{
				arc.WriteCount (pair->Key);
				arc.WriteCount (pair->Value);
			}
		}
	}
}